

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeTypeUrlOrFullTypeName(ParserImpl *this)

{
  undefined1 uVar1;
  bool bVar2;
  string discarded;
  undefined5 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff45;
  byte in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  ParserImpl *in_stack_ffffffffffffff48;
  bool local_aa;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff76;
  byte bVar4;
  allocator<char> in_stack_ffffffffffffff77;
  ParserImpl *in_stack_ffffffffffffff78;
  string local_60 [48];
  string local_30 [47];
  byte local_1;
  
  std::__cxx11::string::string(local_30);
  uVar1 = ConsumeIdentifier(in_stack_ffffffffffffff78,
                            (string *)
                            CONCAT17(in_stack_ffffffffffffff77,
                                     CONCAT16(in_stack_ffffffffffffff76,
                                              CONCAT15(in_stack_ffffffffffffff75,
                                                       CONCAT14(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70)))));
  if ((bool)uVar1) {
    do {
      std::allocator<char>::allocator();
      bVar4 = 0;
      bVar3 = 0;
      std::__cxx11::string::string(local_60,".",(allocator *)&stack0xffffffffffffff9f);
      bVar2 = TryConsume(in_stack_ffffffffffffff48,
                         (string *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT15(in_stack_ffffffffffffff45,
                                                    in_stack_ffffffffffffff40))));
      local_aa = true;
      if (!bVar2) {
        in_stack_ffffffffffffff48 = (ParserImpl *)&stack0xffffffffffffff77;
        std::allocator<char>::allocator();
        bVar4 = 1;
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff78,"/",(allocator *)in_stack_ffffffffffffff48);
        bVar3 = 1;
        in_stack_ffffffffffffff47 =
             TryConsume(in_stack_ffffffffffffff48,
                        (string *)
                        CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT15(in_stack_ffffffffffffff45,
                                                   in_stack_ffffffffffffff40))));
        local_aa = (bool)in_stack_ffffffffffffff47;
      }
      in_stack_ffffffffffffff46 = local_aa;
      if ((bVar3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
        in_stack_ffffffffffffff46 = local_aa;
      }
      if ((bVar4 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
      }
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
      if ((in_stack_ffffffffffffff46 & 1) == 0) {
        local_1 = 1;
        goto LAB_00460995;
      }
      in_stack_ffffffffffffff45 =
           ConsumeIdentifier(in_stack_ffffffffffffff78,
                             (string *)
                             CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(bVar4,CONCAT15(bVar3,CONCAT14(uVar1,
                                                  in_stack_ffffffffffffff70)))));
    } while ((bool)in_stack_ffffffffffffff45);
    local_1 = 0;
  }
  else {
    local_1 = 0;
  }
LAB_00460995:
  local_60[0x20] = (string)0x1;
  local_60[0x21] = (string)0x0;
  local_60[0x22] = (string)0x0;
  local_60[0x23] = (string)0x0;
  std::__cxx11::string::~string(local_30);
  return (bool)(local_1 & 1);
}

Assistant:

bool ConsumeTypeUrlOrFullTypeName() {
    std::string discarded;
    DO(ConsumeIdentifier(&discarded));
    while (TryConsume(".") || TryConsume("/")) {
      DO(ConsumeIdentifier(&discarded));
    }
    return true;
  }